

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ConflictPoolPropagation::conflictAdded(ConflictPoolPropagation *this,HighsInt conflict)

{
  double *pdVar1;
  pointer pWVar2;
  HighsConflictPool *pHVar3;
  pointer ppVar4;
  pointer pHVar5;
  pointer puVar6;
  double dVar7;
  uint uVar8;
  HighsInt HVar9;
  HighsBoundType HVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  int local_3c [3];
  
  pHVar3 = this->conflictpool_;
  ppVar4 = (pHVar3->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar16 = ppVar4[conflict].first;
  lVar19 = (long)iVar16;
  lVar12 = (long)ppVar4[conflict].second;
  if (*(int *)&(this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
      *(int *)&(this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start <= conflict) {
    std::
    vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
    ::resize(&this->watchedLiterals_,(long)(conflict * 2 + 2));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->conflictFlag_,(long)(conflict + 1));
  }
  uVar8 = conflict * 2;
  lVar21 = lVar12 - lVar19;
  lVar20 = lVar19 << 4;
  iVar13 = 0;
  while (bVar22 = lVar21 != 0, lVar21 = lVar21 + -1, bVar22) {
    bVar22 = isActive(this->domain,
                      (HighsDomainChange *)
                      ((long)&((pHVar3->conflictEntries_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_start)->boundval + lVar20));
    if (!bVar22) {
      pdVar1 = (double *)
               ((long)&((pHVar3->conflictEntries_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start)->boundval + lVar20);
      dVar7 = pdVar1[1];
      pWVar2 = (this->watchedLiterals_).
               super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)(uVar8 + iVar13);
      (pWVar2->domchg).boundval = *pdVar1;
      *(double *)&(pWVar2->domchg).column = dVar7;
      linkWatchedLiteral(this,uVar8 + iVar13);
      iVar13 = iVar13 + 1;
      if (iVar13 == 2) {
        iVar13 = 2;
        goto LAB_0029eeea;
      }
    }
    lVar20 = lVar20 + 0x10;
  }
  if (iVar13 == 0) {
    lVar12 = lVar12 - lVar19;
    uVar18 = lVar19 << 4 | 0xc;
    local_3c[0] = 0;
    local_3c[2] = 0;
    iVar13 = 0;
    lVar19 = 0;
    iVar17 = 0;
    while( true ) {
      bVar22 = lVar12 == 0;
      lVar12 = lVar12 + -1;
      if (bVar22) break;
      pHVar5 = (pHVar3->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar14 = &this->domain->colUpperPos_;
      if (*(int *)((long)&pHVar5->boundval + uVar18) == 0) {
        pvVar14 = &this->domain->colLowerPos_;
      }
      iVar15 = (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[*(int *)((long)pHVar5 + (uVar18 - 4))];
      iVar11 = iVar17;
      if ((int)lVar19 == 2) {
        if (iVar13 < iVar15) goto LAB_0029ee5b;
LAB_0029ee7c:
        iVar15 = iVar11;
        lVar19 = 2;
      }
      else {
        if ((int)lVar19 == 1) {
LAB_0029ee5b:
          iVar13 = iVar15;
          local_3c[2] = iVar16;
          if (iVar17 < iVar15) {
            iVar11 = iVar15;
            iVar13 = iVar17;
            local_3c[2] = local_3c[0];
            local_3c[0] = iVar16;
          }
          goto LAB_0029ee7c;
        }
        lVar19 = 1;
        local_3c[0] = iVar16;
      }
      iVar16 = iVar16 + 1;
      uVar18 = uVar18 + 0x10;
      iVar17 = iVar15;
    }
    lVar20 = (long)(int)uVar8 * 0x18;
    for (lVar12 = 0; lVar19 != lVar12; lVar12 = lVar12 + 1) {
      pHVar5 = (pHVar3->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start + local_3c[lVar12 * 2];
      dVar7 = *(double *)&pHVar5->column;
      pdVar1 = (double *)
               ((long)&(((this->watchedLiterals_).
                         super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                         ._M_impl.super__Vector_impl_data._M_start)->domchg).boundval + lVar20);
      *pdVar1 = pHVar5->boundval;
      pdVar1[1] = dVar7;
      linkWatchedLiteral(this,uVar8 + (int)lVar12);
      lVar20 = lVar20 + 0x18;
    }
    iVar13 = 0;
  }
  else if (iVar13 == 1) {
    lVar12 = lVar12 - lVar19;
    uVar18 = lVar19 << 4 | 0xc;
    iVar17 = -1;
    iVar13 = -1;
    while (bVar22 = lVar12 != 0, lVar12 = lVar12 + -1, bVar22) {
      pHVar5 = (pHVar3->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar14 = &this->domain->colUpperPos_;
      if (*(int *)((long)&pHVar5->boundval + uVar18) == 0) {
        pvVar14 = &this->domain->colLowerPos_;
      }
      iVar15 = (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[*(int *)((long)pHVar5 + (uVar18 - 4))];
      if (iVar13 < iVar15) {
        iVar13 = iVar15;
        iVar17 = iVar16;
      }
      iVar16 = iVar16 + 1;
      uVar18 = uVar18 + 0x10;
    }
    iVar13 = 1;
    if (iVar17 != -1) {
      pHVar5 = (pHVar3->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start + iVar17;
      HVar9 = pHVar5->column;
      HVar10 = pHVar5->boundtype;
      pWVar2 = (this->watchedLiterals_).
               super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)(uVar8 | 1);
      (pWVar2->domchg).boundval = pHVar5->boundval;
      (pWVar2->domchg).column = HVar9;
      (pWVar2->domchg).boundtype = HVar10;
      linkWatchedLiteral(this,uVar8 | 1);
    }
  }
LAB_0029eeea:
  puVar6 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6[conflict] = (byte)iVar13 | puVar6[conflict] & 4;
  markPropagateConflict(this,conflict);
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::conflictAdded(HighsInt conflict) {
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;
  const std::vector<HighsDomainChange>& conflictEntries =
      conflictpool_->getConflictEntryVector();

  if (HighsInt(conflictFlag_.size()) <= conflict) {
    watchedLiterals_.resize(2 * conflict + 2);
    conflictFlag_.resize(conflict + 1);
  }

  HighsInt numWatched = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(conflictEntries[i])) continue;
    HighsInt watchPos = 2 * conflict + numWatched;
    watchedLiterals_[watchPos].domchg = conflictEntries[i];
    linkWatchedLiteral(watchPos);
    if (++numWatched == 2) break;
  }
  switch (numWatched) {
    case 0: {
      std::array<std::pair<HighsInt, HighsInt>, 2> latestActive;
      HighsInt numActive = 0;
      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        switch (numActive) {
          case 0:
            latestActive[0] = std::make_pair(pos, i);
            numActive = 1;
            break;
          case 1:
            latestActive[1] = std::make_pair(pos, i);
            numActive = 2;
            if (latestActive[0].first < latestActive[1].first)
              std::swap(latestActive[0], latestActive[1]);
            break;
          case 2:
            if (pos > latestActive[1].first) {
              latestActive[1] = std::make_pair(pos, i);
              if (latestActive[0].first < latestActive[1].first)
                std::swap(latestActive[0], latestActive[1]);
            }
        }
      }
      for (HighsInt i = 0; i < numActive; ++i) {
        HighsInt watchPos = 2 * conflict + i;
        watchedLiterals_[watchPos].domchg =
            conflictEntries[latestActive[i].second];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 1: {
      HighsInt latestActive = -1;
      HighsInt latestPos = -1;

      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        if (pos > latestPos) {
          latestActive = i;
          latestPos = pos;
        }
      }
      if (latestActive != -1) {
        HighsInt watchPos = 2 * conflict + 1;
        watchedLiterals_[watchPos].domchg = conflictEntries[latestActive];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 2:
      break;
  }

  conflictFlag_[conflict] = numWatched | (conflictFlag_[conflict] & 4);
  markPropagateConflict(conflict);
}